

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int test_c2d_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  ulong in_RAX;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  ulong uStack_28;
  
  uStack_28 = in_RAX & 0xff000000ffffffff;
  device_client = create_device_client(handle,create_type,protocol);
  if (device_client == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x292;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"test_c2d_with_device_client",0x291,1,"Failure creating davice client");
    return 0x292;
  }
  iVar1 = test_all_device_options(handle->protocol,device_client);
  if (iVar1 == 0) {
    IVar2 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                      (device_client,connection_status_callback,&bc_msg_ctx);
    if (IVar2 == IOTHUB_CLIENT_OK) {
      IVar2 = IoTHubDeviceClient_LL_SetMessageCallback(device_client,c2d_msg_callback,&bc_msg_ctx);
      if (IVar2 == IOTHUB_CLIENT_OK) {
        lVar6 = 0x14;
        while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
          IoTHubDeviceClient_LL_DoWork(device_client);
        }
        iVar1 = 0;
        goto LAB_0011b748;
      }
      p_Var3 = xlogging_get_log_function();
      iVar1 = 0x2a3;
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011b748;
      pcVar5 = "Failure setting c2d Message callback";
      iVar4 = 0x2a2;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      iVar1 = 0x29e;
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011b748;
      pcVar5 = "Failure setting connection status callback";
      iVar4 = 0x29d;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x299;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011b748;
    pcVar5 = "Failure testing all device options";
    iVar4 = 0x298;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"test_c2d_with_device_client",iVar4,1,pcVar5);
LAB_0011b748:
  IoTHubDeviceClient_LL_Destroy(device_client);
  if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
    IoTHubTransport_Destroy(handle->transport_handle);
  }
  return iVar1;
}

Assistant:

int test_c2d_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (test_all_device_options(handle->protocol, device_client) != 0)
        {
            LogError("Failure testing all device options");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetMessageCallback(device_client, c2d_msg_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting c2d Message callback");
            result = __LINE__;
        }
        else
        {
            // Loop a few time since the service will not send any value here
            for (size_t index = 0; index < DO_WORK_LOOP_COUNTER; index++)
            {
                IoTHubDeviceClient_LL_DoWork(device_client);
            }
            result = 0;
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return result;
}